

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O2

void __thiscall
basisu::image_metrics::calc
          (image_metrics *this,image *a,image *b,uint32_t first_chan,uint32_t total_chans,
          bool avg_comp_error,bool use_601_luma)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  uint32_t i;
  uint uVar5;
  int iVar6;
  int iVar7;
  color_rgba *this_00;
  color_rgba *this_01;
  byte *pbVar8;
  long lVar9;
  uint uVar10;
  uint32_t x;
  uint32_t uVar11;
  uint32_t uVar12;
  uint uVar13;
  uint32_t index;
  uint32_t uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  double dVar19;
  float fVar20;
  double dVar21;
  double hist [256];
  
  if ((first_chan < 4) && (total_chans + first_chan < 5)) {
    uVar10 = b->m_width;
    if (a->m_width < b->m_width) {
      uVar10 = a->m_width;
    }
    uVar5 = b->m_height;
    if (a->m_height < b->m_height) {
      uVar5 = a->m_height;
    }
    memset(hist,0,0x800);
    for (uVar12 = 0; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
        this_00 = image::operator()(a,uVar11,uVar12);
        this_01 = image::operator()(b,uVar11,uVar12);
        uVar14 = total_chans;
        index = first_chan;
        if (total_chans == 0) {
          if (use_601_luma) {
            iVar6 = color_rgba::get_601_luma(this_00);
            iVar7 = color_rgba::get_601_luma(this_01);
          }
          else {
            iVar6 = color_rgba::get_709_luma(this_00);
            iVar7 = color_rgba::get_709_luma(this_01);
          }
          uVar13 = iVar6 - iVar7;
          uVar2 = -uVar13;
          if (0 < (int)uVar13) {
            uVar2 = uVar13;
          }
          hist[uVar2] = hist[uVar2] + 1.0;
        }
        else {
          while (uVar14 != 0) {
            pbVar8 = color_rgba::operator[](this_00,index);
            bVar1 = *pbVar8;
            pbVar8 = color_rgba::operator[](this_01,index);
            bVar3 = (byte)((uint)bVar1 - (uint)*pbVar8);
            bVar4 = -bVar3;
            if (0 < (int)((uint)bVar1 - (uint)*pbVar8)) {
              bVar4 = bVar3;
            }
            hist[bVar4] = hist[bVar4] + 1.0;
            uVar14 = uVar14 - 1;
            index = index + 1;
          }
        }
      }
    }
    this->m_max = 0.0;
    auVar16 = ZEXT816(0);
    fVar17 = 0.0;
    for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 1) {
      dVar19 = hist[lVar9];
      if ((dVar19 != 0.0) || (NAN(dVar19))) {
        fVar20 = (float)(int)lVar9;
        if (fVar17 <= fVar20) {
          fVar17 = fVar20;
        }
        this->m_max = fVar17;
        dVar21 = (double)(int)lVar9;
        dVar19 = dVar19 * dVar21;
        dVar15 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + dVar19;
        auVar16._8_8_ = dVar15 + dVar21 * dVar19;
      }
    }
    dVar19 = (double)uVar5 * (double)uVar10;
    if (avg_comp_error) {
      uVar12 = 4;
      if (total_chans < 4) {
        uVar12 = total_chans;
      }
      uVar11 = 1;
      if (total_chans != 0) {
        uVar11 = uVar12;
      }
      dVar19 = dVar19 * (double)(int)uVar11;
    }
    auVar18._8_4_ = SUB84(dVar19,0);
    auVar18._0_8_ = dVar19;
    auVar18._12_4_ = (int)((ulong)dVar19 >> 0x20);
    auVar16 = divpd(auVar16,auVar18);
    auVar18 = minpd(_DAT_00308940,auVar16);
    fVar17 = (float)(double)(-(ulong)(0.0 <= auVar16._8_8_) & auVar18._8_8_);
    this->m_mean = (float)(double)(-(ulong)(0.0 <= auVar16._0_8_) & auVar18._0_8_);
    this->m_mean_squared = fVar17;
    if (fVar17 < 0.0) {
      fVar17 = sqrtf(fVar17);
    }
    else {
      fVar17 = SQRT(fVar17);
    }
    this->m_rms = fVar17;
    if ((fVar17 != 0.0) || (NAN(fVar17))) {
      dVar15 = log10(255.0 / (double)fVar17);
      dVar15 = dVar15 * 20.0;
      dVar19 = 100.0;
      if (dVar15 <= 100.0) {
        dVar19 = dVar15;
      }
      fVar17 = (float)(double)(~-(ulong)(dVar15 < 0.0) & (ulong)dVar19);
    }
    else {
      fVar17 = 100.0;
    }
    this->m_psnr = fVar17;
    return;
  }
  __assert_fail("(first_chan < 4U) && (first_chan + total_chans <= 4U)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.cpp"
                ,0x56b,
                "void basisu::image_metrics::calc(const image &, const image &, uint32_t, uint32_t, bool, bool)"
               );
}

Assistant:

void image_metrics::calc(const image &a, const image &b, uint32_t first_chan, uint32_t total_chans, bool avg_comp_error, bool use_601_luma)
	{
		assert((first_chan < 4U) && (first_chan + total_chans <= 4U));

		const uint32_t width = basisu::minimum(a.get_width(), b.get_width());
		const uint32_t height = basisu::minimum(a.get_height(), b.get_height());

		double hist[256];
		clear_obj(hist);

		for (uint32_t y = 0; y < height; y++)
		{
			for (uint32_t x = 0; x < width; x++)
			{
				const color_rgba &ca = a(x, y), &cb = b(x, y);

				if (total_chans)
				{
					for (uint32_t c = 0; c < total_chans; c++)
						hist[iabs(ca[first_chan + c] - cb[first_chan + c])]++;
				}
				else
				{
					if (use_601_luma)
						hist[iabs(ca.get_601_luma() - cb.get_601_luma())]++;
					else
						hist[iabs(ca.get_709_luma() - cb.get_709_luma())]++;
				}
			}
		}

		m_max = 0;
		double sum = 0.0f, sum2 = 0.0f;
		for (uint32_t i = 0; i < 256; i++)
		{
			if (hist[i])
			{
				m_max = basisu::maximum<float>(m_max, (float)i);
				double v = i * hist[i];
				sum += v;
				sum2 += i * v;
			}
		}

		double total_values = (double)width * (double)height;
		if (avg_comp_error)
			total_values *= (double)clamp<uint32_t>(total_chans, 1, 4);

		m_mean = (float)clamp<double>(sum / total_values, 0.0f, 255.0);
		m_mean_squared = (float)clamp<double>(sum2 / total_values, 0.0f, 255.0f * 255.0f);
		m_rms = (float)sqrt(m_mean_squared);
		m_psnr = m_rms ? (float)clamp<double>(log10(255.0 / m_rms) * 20.0f, 0.0f, 100.0f) : 100.0f;
	}